

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.h
# Opt level: O1

void __thiscall
rest_rpc::rpc_service::connection::response_interal
          (connection *this,uint64_t req_id,
          shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *data,request_type req_type)

{
  _Map_pointer ppmVar1;
  size_t __n;
  void *__buf;
  int __fd;
  message_type local_28;
  
  __fd = (int)&local_28;
  local_28.content.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (data->
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr;
  local_28.content.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (data->
       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
       )._M_refcount._M_pi;
  (data->
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  )._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (data->
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  )._M_ptr = (element_type *)0x0;
  local_28.req_id = req_id;
  local_28.req_type = req_type;
  std::deque<rest_rpc::message_type,_std::allocator<rest_rpc::message_type>_>::
  emplace_back<rest_rpc::message_type>(&this->write_queue_,&local_28);
  if (local_28.content.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.content.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  ppmVar1 = (this->write_queue_).
            super__Deque_base<rest_rpc::message_type,_std::allocator<rest_rpc::message_type>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node;
  __n = ((((ulong)((long)ppmVar1 -
                  (long)(this->write_queue_).
                        super__Deque_base<rest_rpc::message_type,_std::allocator<rest_rpc::message_type>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
        (ulong)(ppmVar1 == (_Map_pointer)0x0)) * 0x10;
  __buf = (void *)(((long)(this->write_queue_).
                          super__Deque_base<rest_rpc::message_type,_std::allocator<rest_rpc::message_type>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_last -
                    (long)(this->write_queue_).
                          super__Deque_base<rest_rpc::message_type,_std::allocator<rest_rpc::message_type>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur >> 5) +
                   ((long)(this->write_queue_).
                          super__Deque_base<rest_rpc::message_type,_std::allocator<rest_rpc::message_type>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                    (long)(this->write_queue_).
                          super__Deque_base<rest_rpc::message_type,_std::allocator<rest_rpc::message_type>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first >> 5) + __n);
  if (__buf < (void *)0x2) {
    write(this,__fd,__buf,__n);
  }
  return;
}

Assistant:

void response_interal(uint64_t req_id, std::shared_ptr<std::string> data,
                        request_type req_type = request_type::req_res) {
    assert(data->size() < MAX_BUF_LEN);

    write_queue_.emplace_back(message_type{req_id, req_type, std::move(data)});
    if (write_queue_.size() > 1) {
      return;
    }

    write();
  }